

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

NumericExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::ReadNumericExpr_abi_cxx11_
          (NumericExpr *__return_storage_ptr__,
          NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
          *this,int opcode)

{
  Kind KVar1;
  long *plVar2;
  char *pcVar3;
  int iVar4;
  LogicalExpr condition;
  NumericExpr then_expr;
  NumericExpr else_expr;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::NumericExprReader>
  local_1c8;
  NumericExpr local_188;
  NumericExpr local_168;
  long *local_148 [2];
  long local_138 [2];
  long *local_128 [2];
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  Expr local_a8;
  NumericExpr local_88;
  Reference local_68;
  NumericExpr local_48;
  
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr_abi_cxx11_(&local_1c8.lhs,this);
    plVar2 = *(long **)this;
    pcVar3 = (char *)*plVar2;
    plVar2[3] = (long)pcVar3;
    *plVar2 = (long)(pcVar3 + 1);
    ReadNumericExpr_abi_cxx11_(&local_188,this,*pcVar3,false);
    plVar2 = *(long **)this;
    pcVar3 = (char *)*plVar2;
    plVar2[3] = (long)pcVar3;
    *plVar2 = (long)(pcVar3 + 1);
    ReadNumericExpr_abi_cxx11_(&local_168,this,*pcVar3,false);
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,local_1c8.lhs._M_dataplus._M_p,
               local_1c8.lhs._M_dataplus._M_p + local_1c8.lhs._M_string_length);
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,local_168._M_dataplus._M_p,
               local_168._M_dataplus._M_p + local_168._M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    if (local_148[0] != local_138) {
      operator_delete(local_148[0],local_138[0] + 1);
    }
    if (local_128[0] != local_118) {
      operator_delete(local_128[0],local_118[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    local_1c8.rhs.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
    local_1c8.rhs._M_dataplus._M_p = local_188._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_00126698:
      operator_delete(local_1c8.rhs._M_dataplus._M_p,local_1c8.rhs.field_2._M_allocated_capacity + 1
                     );
    }
    goto LAB_001266a0;
  case PLTERM:
    iVar4 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                      (*(BinaryReader<mp::internal::IdentityConverter> **)this);
    if (iVar4 < 2) {
      local_1c8.lhs._M_dataplus._M_p = (pointer)0x0;
      local_1c8.lhs._M_string_length = 0;
      local_188._M_dataplus._M_p = (pointer)0x0;
      local_188._M_string_length = (size_type)&local_1c8;
      BinaryReaderBase::ReportError
                (*(BinaryReaderBase **)this,(CStringRef)0x139f33,(ArgList *)&local_188);
    }
    else {
      iVar4 = iVar4 + -1;
      do {
        plVar2 = *(long **)this;
        pcVar3 = (char *)*plVar2;
        plVar2[3] = (long)pcVar3;
        *plVar2 = (long)(pcVar3 + 1);
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
        ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                        *)this,*pcVar3);
        plVar2 = *(long **)this;
        pcVar3 = (char *)*plVar2;
        plVar2[3] = (long)pcVar3;
        *plVar2 = (long)(pcVar3 + 1);
        NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
        ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                        *)this,*pcVar3);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    plVar2 = *(long **)this;
    pcVar3 = (char *)*plVar2;
    plVar2[3] = (long)pcVar3;
    *plVar2 = (long)(pcVar3 + 1);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
    ::ReadConstant((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                    *)this,*pcVar3);
    ReadReference_abi_cxx11_(&local_68,this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001266b3;
  case CALL:
  case LAST_VARARG:
switchD_001261e7_caseD_29:
    local_1c8.lhs._M_dataplus._M_p = (pointer)0x0;
    local_1c8.lhs._M_string_length = 0;
    local_188._M_dataplus._M_p = (pointer)0x0;
    local_188._M_string_length = (size_type)&local_1c8;
    BinaryReaderBase::ReportError
              (*(BinaryReaderBase **)this,(CStringRef)0x139f5b,(ArgList *)&local_188);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    goto LAB_001265d8;
  case FIRST_ITERATED:
    iVar4 = 1;
    goto LAB_00126401;
  case SUM:
    iVar4 = 3;
LAB_00126401:
    iVar4 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,iVar4);
LAB_001265c4:
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar4,(ArgHandler *)&local_1c8);
    break;
  case LAST_ITERATED:
    iVar4 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,1);
    plVar2 = *(long **)this;
    pcVar3 = (char *)*plVar2;
    plVar2[3] = (long)pcVar3;
    *plVar2 = (long)(pcVar3 + 1);
    ReadNumericExpr_abi_cxx11_(&local_88,this,*pcVar3,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    iVar4 = iVar4 + -1;
    goto LAB_001265c4;
  case NUMBEROF_SYM:
    iVar4 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,1);
    ReadSymbolicExpr_abi_cxx11_(&local_a8,this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar4 + -1,(ArgHandler *)&local_1c8);
    break;
  case COUNT:
    iVar4 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
            ::ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                           *)this,1);
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::ArgHandler>
              (this,iVar4,(ArgHandler *)&local_1c8);
    break;
  default:
    if (KVar1 != ADD) {
      if (KVar1 == FIRST_UNARY) {
        plVar2 = *(long **)this;
        pcVar3 = (char *)*plVar2;
        plVar2[3] = (long)pcVar3;
        *plVar2 = (long)(pcVar3 + 1);
        ReadNumericExpr_abi_cxx11_(&local_48,this,*pcVar3,false);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p == &local_48.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_001266b3;
      }
      goto switchD_001261e7_caseD_29;
    }
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
    ::
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>::NumericExprReader>
    ::BinaryArgReader(&local_1c8,
                      (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
                       *)this);
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,local_1c8.lhs._M_dataplus._M_p,
               local_1c8.lhs._M_dataplus._M_p + local_1c8.lhs._M_string_length);
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_1c8.rhs._M_dataplus._M_p,
               local_1c8.rhs._M_dataplus._M_p + local_1c8.rhs._M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0],local_f8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.rhs._M_dataplus._M_p != &local_1c8.rhs.field_2) goto LAB_00126698;
LAB_001266a0:
    local_48.field_2._M_allocated_capacity = local_1c8.lhs.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_1c8.lhs._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.lhs._M_dataplus._M_p == &local_1c8.lhs.field_2) {
      return __return_storage_ptr__;
    }
LAB_001266b3:
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
LAB_001265d8:
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}